

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

cgltf_result
cgltf_default_file_read
          (cgltf_memory_options *memory_options,cgltf_file_options *file_options,char *path,
          cgltf_size *size,void **data)

{
  FILE *__stream;
  void *__ptr;
  size_t sVar1;
  cgltf_size local_88;
  _func_void_void_ptr_void_ptr *local_80;
  _func_void_ptr_void_ptr_cgltf_size *local_78;
  cgltf_size read_size;
  char *file_data;
  long length;
  cgltf_size file_size;
  FILE *file;
  _func_void_void_ptr_void_ptr *memory_free;
  _func_void_ptr_void_ptr_cgltf_size *memory_alloc;
  void **data_local;
  cgltf_size *size_local;
  char *path_local;
  cgltf_file_options *file_options_local;
  cgltf_memory_options *memory_options_local;
  
  if (memory_options->alloc == (_func_void_ptr_void_ptr_cgltf_size *)0x0) {
    local_78 = cgltf_default_alloc;
  }
  else {
    local_78 = memory_options->alloc;
  }
  if (memory_options->free == (_func_void_void_ptr_void_ptr *)0x0) {
    local_80 = cgltf_default_free;
  }
  else {
    local_80 = memory_options->free;
  }
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    memory_options_local._4_4_ = cgltf_result_file_not_found;
  }
  else {
    if (size == (cgltf_size *)0x0) {
      local_88 = 0;
    }
    else {
      local_88 = *size;
    }
    length = local_88;
    if (local_88 == 0) {
      fseek(__stream,0,2);
      length = ftell(__stream);
      if (length < 0) {
        fclose(__stream);
        return cgltf_result_io_error;
      }
      fseek(__stream,0,0);
    }
    __ptr = (*local_78)(memory_options->user_data,length);
    if (__ptr == (void *)0x0) {
      fclose(__stream);
      memory_options_local._4_4_ = cgltf_result_out_of_memory;
    }
    else {
      sVar1 = fread(__ptr,1,length,__stream);
      fclose(__stream);
      if (sVar1 == length) {
        if (size != (cgltf_size *)0x0) {
          *size = length;
        }
        if (data != (void **)0x0) {
          *data = __ptr;
        }
        memory_options_local._4_4_ = cgltf_result_success;
      }
      else {
        (*local_80)(memory_options->user_data,__ptr);
        memory_options_local._4_4_ = cgltf_result_io_error;
      }
    }
  }
  return memory_options_local._4_4_;
}

Assistant:

static cgltf_result cgltf_default_file_read(const struct cgltf_memory_options* memory_options, const struct cgltf_file_options* file_options, const char* path, cgltf_size* size, void** data)
{
    (void)file_options;
    void* (*memory_alloc)(void*, cgltf_size) = memory_options->alloc ? memory_options->alloc : &cgltf_default_alloc;
    void (*memory_free)(void*, void*) = memory_options->free ? memory_options->free : &cgltf_default_free;

    FILE* file = fopen(path, "rb");
    if (!file)
    {
        return cgltf_result_file_not_found;
    }

    cgltf_size file_size = size ? *size : 0;

    if (file_size == 0)
    {
        fseek(file, 0, SEEK_END);

        long length = ftell(file);
        if (length < 0)
        {
            fclose(file);
            return cgltf_result_io_error;
        }

        fseek(file, 0, SEEK_SET);
        file_size = (cgltf_size)length;
    }

    char* file_data = (char*)memory_alloc(memory_options->user_data, file_size);
    if (!file_data)
    {
        fclose(file);
        return cgltf_result_out_of_memory;
    }

    cgltf_size read_size = fread(file_data, 1, file_size, file);

    fclose(file);

    if (read_size != file_size)
    {
        memory_free(memory_options->user_data, file_data);
        return cgltf_result_io_error;
    }

    if (size)
    {
        *size = file_size;
    }
    if (data)
    {
        *data = file_data;
    }

    return cgltf_result_success;
}